

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wif_trace.cpp
# Opt level: O3

ssize_t __thiscall
sc_core::wif_unsigned_int_trace::write(wif_unsigned_int_trace *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  ulong __n_00;
  char buf [1000];
  byte local_408 [1008];
  
  uVar1 = *this->object;
  uVar3 = (this->super_wif_trace).bit_width;
  __n_00 = (ulong)uVar3;
  if ((uVar1 & ~this->mask) == 0) {
    if (0 < (int)uVar3) {
      uVar3 = 1 << ((char)uVar3 - 1U & 0x1f);
      uVar2 = 0;
      do {
        local_408[uVar2] = (uVar1 & uVar3) == 0 ^ 0x31;
        uVar3 = uVar3 >> 1;
        uVar2 = uVar2 + 1;
      } while (__n_00 != uVar2);
      goto LAB_0020f5e5;
    }
  }
  else if (0 < (int)uVar3) {
    memset(local_408,0x30,__n_00);
    goto LAB_0020f5e5;
  }
  __n_00 = 0;
LAB_0020f5e5:
  local_408[__n_00] = 0;
  fprintf((FILE *)CONCAT44(in_register_00000034,__fd),"assign %s \"%s\" ;\n",
          (this->super_wif_trace).wif_name._M_dataplus._M_p,local_408);
  uVar1 = *this->object;
  this->old_value = uVar1;
  return (ulong)uVar1;
}

Assistant:

void wif_unsigned_int_trace::write(FILE* f)
{
    char buf[1000];
    int bitindex;

    // Check for overflow
    if ((object & mask) != object) {
        for (bitindex = 0; bitindex < bit_width; bitindex++) {
            buf[bitindex] = '0';
        }
    }
    else{
        unsigned bit_mask = 1 << (bit_width-1);
        for (bitindex = 0; bitindex < bit_width; bitindex++) {
            buf[bitindex] = (object & bit_mask)? '1' : '0';
            bit_mask = bit_mask >> 1;
        }
    }
    buf[bitindex] = '\0';
    std::fprintf(f, "assign %s \"%s\" ;\n", wif_name.c_str(), buf);
    old_value = object;
}